

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umemstream.h
# Opt level: O2

void __thiscall umemstream::umemstream(umemstream *this,char *p,size_t l)

{
  std::ios::ios((ios *)&(this->super_istream).field_0x50);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__umemstream_001a1708;
  *(undefined ***)&(this->super_istream).field_0x50 = &PTR__umemstream_001a1730;
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__001a1748);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__umemstream_001a1708;
  *(undefined ***)&(this->super_istream).field_0x50 = &PTR__umemstream_001a1730;
  umembuf::umembuf((umembuf *)&(this->super_istream).field_0x10,p,l);
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_istream)._vptr_basic_istream +
                  (long)(this->super_istream)._vptr_basic_istream[-3]));
  return;
}

Assistant:

umemstream(const char *p, size_t l) : std::istream(&buffer_),
    buffer_(p, l) {
    rdbuf(&buffer_);
  }